

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffgeom2pose-test.cxx
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  char *benchmark;
  char *pcVar2;
  
  if (argc == 3) {
    pcVar2 = argv[1];
    iVar1 = strcmp(pcVar2,"double");
    if ((iVar1 == 0) && (iVar1 = strcmp(argv[2],"-benchmark"), iVar1 == 0)) {
LAB_0010180d:
      pcVar2 = "double";
    }
    else {
      iVar1 = strcmp(pcVar2,"float");
      if ((iVar1 != 0) || (iVar1 = strcmp(argv[2],"-benchmark"), iVar1 != 0)) goto LAB_001017c4;
      pcVar2 = "float";
    }
    benchmark = "benchmark";
    goto LAB_00101830;
  }
  if (argc == 2) {
    pcVar2 = argv[1];
    iVar1 = strcmp(pcVar2,"double");
    if (iVar1 == 0) goto LAB_0010175f;
    iVar1 = strcmp(pcVar2,"float");
    if (iVar1 != 0) {
      iVar1 = strcmp(pcVar2,"-benchmark");
      if (iVar1 != 0) goto LAB_001017c4;
      goto LAB_0010180d;
    }
    pcVar2 = "float";
  }
  else {
    if (argc != 1) {
LAB_001017c4:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "usage: ./cmd [-benchmark]\n       ./cmd [double | float] [-benchmark]",0x44);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
      return 1;
    }
LAB_0010175f:
    pcVar2 = "double";
  }
  benchmark = "no";
LAB_00101830:
  test_run(pcVar2,benchmark);
  return 0;
}

Assistant:

int main(int argc, const char* argv[])
{
	switch (argc) {
	case 1:
		test_run("double");
		return 0;
	case 2:
		if      (strcmp(argv[1], "double")     == 0) test_run("double");
		else if (strcmp(argv[1], "float")      == 0) test_run("float");
		else if (strcmp(argv[1], "-benchmark") == 0) test_run("double", "benchmark");
		else break;
		return 0;
	case 3:
		if      ((strcmp(argv[1], "double") == 0) && (strcmp(argv[2], "-benchmark") == 0))
			test_run("double", "benchmark");
		else if ((strcmp(argv[1], "float")  == 0) && (strcmp(argv[2], "-benchmark") == 0))
			test_run("float", "benchmark");
		else break;
		return 0;
	}
	std::cout << "usage: ./cmd [-benchmark]\n"
				 "       ./cmd [double | float] [-benchmark]" << std::endl;
    return 1;
}